

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O2

void __thiscall
OpenMD::ContactAngle1::ContactAngle1
          (ContactAngle1 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType dropletRadius)

{
  ostream *poVar1;
  string paramString;
  stringstream params;
  string local_1b8;
  undefined1 local_198 [392];
  
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__SequentialAnalyzer_00221990;
  this->solidZ_ = solidZ;
  this->dropletRadius_ = dropletRadius;
  getPrefix(&local_1b8,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 &local_1b8,".ca1");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::operator<<((ostream *)(local_198 + 0x10)," solid Z = ");
  poVar1 = std::ostream::_M_insert<double>(this->solidZ_);
  std::operator<<(poVar1,", droplet radius = ");
  std::ostream::_M_insert<double>(this->dropletRadius_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

ContactAngle1::ContactAngle1(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType dropletRadius) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), dropletRadius_(dropletRadius) {
    setOutputName(getPrefix(filename) + ".ca1");

    std::stringstream params;
    params << " solid Z = " << solidZ_
           << ", droplet radius = " << dropletRadius_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }